

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O0

void __thiscall
llvm::write_double(llvm *this,raw_ostream *S,double N,FloatStyle Style,
                  Optional<unsigned_long> Precision)

{
  uint uVar1;
  raw_ostream *prVar2;
  char *Fmt;
  undefined4 in_register_00000014;
  format_object<double> local_e0;
  char local_c8 [8];
  char Buf [32];
  undefined1 local_90 [8];
  raw_svector_ostream Out;
  SmallString<8U> Spec;
  size_t sStack_40;
  char Letter;
  unsigned_long local_38;
  size_t Prec;
  double dStack_28;
  FloatStyle Style_local;
  double N_local;
  raw_ostream *S_local;
  Optional<unsigned_long> Precision_local;
  
  S_local = (raw_ostream *)CONCAT44(in_register_00000014,Style);
  Precision_local.Storage.field_0.empty = Precision.Storage.field_0._0_1_;
  Prec._4_4_ = (FloatStyle)S;
  dStack_28 = N;
  N_local = (double)this;
  sStack_40 = getDefaultPrecision(Prec._4_4_);
  local_38 = Optional<unsigned_long>::getValueOr<unsigned_long>
                       ((Optional<unsigned_long> *)&S_local,&stack0xffffffffffffffc0);
  uVar1 = std::isnan(dStack_28);
  if ((uVar1 & 1) == 0) {
    uVar1 = std::isinf(dStack_28);
    if ((uVar1 & 1) == 0) {
      if (Prec._4_4_ == Exponent) {
        Spec.super_SmallVector<char,_8U>.super_SmallVectorStorage<char,_8U>.InlineElts[7].buffer[0]
             = (char  [1])'e';
      }
      else if (Prec._4_4_ == ExponentUpper) {
        Spec.super_SmallVector<char,_8U>.super_SmallVectorStorage<char,_8U>.InlineElts[7].buffer[0]
             = (char  [1])'E';
      }
      else {
        Spec.super_SmallVector<char,_8U>.super_SmallVectorStorage<char,_8U>.InlineElts[7].buffer[0]
             = (char  [1])'f';
      }
      SmallString<8U>::SmallString((SmallString<8U> *)&Out.OS);
      raw_svector_ostream::raw_svector_ostream
                ((raw_svector_ostream *)local_90,(SmallVectorImpl<char> *)&Out.OS);
      prVar2 = raw_ostream::operator<<((raw_ostream *)local_90,"%.");
      prVar2 = raw_ostream::operator<<(prVar2,local_38);
      raw_ostream::operator<<
                (prVar2,(char)Spec.super_SmallVector<char,_8U>.super_SmallVectorStorage<char,_8U>.
                              InlineElts[7].buffer[0]);
      if (Prec._4_4_ == Percent) {
        dStack_28 = dStack_28 * 100.0;
      }
      Fmt = SmallString<8U>::c_str((SmallString<8U> *)&Out.OS);
      format<double>(&local_e0,Fmt,&stack0xffffffffffffffd8);
      format_object<double>::snprint(&local_e0,local_c8,0x20);
      raw_ostream::operator<<((raw_ostream *)N_local,local_c8);
      if (Prec._4_4_ == Percent) {
        raw_ostream::operator<<((raw_ostream *)N_local,'%');
      }
      raw_svector_ostream::~raw_svector_ostream((raw_svector_ostream *)local_90);
      SmallString<8U>::~SmallString((SmallString<8U> *)&Out.OS);
    }
    else {
      raw_ostream::operator<<((raw_ostream *)N_local,"INF");
    }
  }
  else {
    raw_ostream::operator<<((raw_ostream *)N_local,"nan");
  }
  return;
}

Assistant:

void llvm::write_double(raw_ostream &S, double N, FloatStyle Style,
                        Optional<size_t> Precision) {
  size_t Prec = Precision.getValueOr(getDefaultPrecision(Style));

  if (std::isnan(N)) {
    S << "nan";
    return;
  } else if (std::isinf(N)) {
    S << "INF";
    return;
  }

  char Letter;
  if (Style == FloatStyle::Exponent)
    Letter = 'e';
  else if (Style == FloatStyle::ExponentUpper)
    Letter = 'E';
  else
    Letter = 'f';

  SmallString<8> Spec;
  llvm::raw_svector_ostream Out(Spec);
  Out << "%." << Prec << Letter;

  if (Style == FloatStyle::Exponent || Style == FloatStyle::ExponentUpper) {
#ifdef _WIN32
// On MSVCRT and compatible, output of %e is incompatible to Posix
// by default. Number of exponent digits should be at least 2. "%+03d"
// FIXME: Implement our formatter to here or Support/Format.h!
#if defined(__MINGW32__)
    // FIXME: It should be generic to C++11.
    if (N == 0.0 && std::signbit(N)) {
      char NegativeZero[] = "-0.000000e+00";
      if (Style == FloatStyle::ExponentUpper)
        NegativeZero[strlen(NegativeZero) - 4] = 'E';
      S << NegativeZero;
      return;
    }
#else
    int fpcl = _fpclass(N);

    // negative zero
    if (fpcl == _FPCLASS_NZ) {
      char NegativeZero[] = "-0.000000e+00";
      if (Style == FloatStyle::ExponentUpper)
        NegativeZero[strlen(NegativeZero) - 4] = 'E';
      S << NegativeZero;
      return;
    }
#endif

    char buf[32];
    unsigned len;
    len = format(Spec.c_str(), N).snprint(buf, sizeof(buf));
    if (len <= sizeof(buf) - 2) {
      if (len >= 5 && (buf[len - 5] == 'e' || buf[len - 5] == 'E') &&
          buf[len - 3] == '0') {
        int cs = buf[len - 4];
        if (cs == '+' || cs == '-') {
          int c1 = buf[len - 2];
          int c0 = buf[len - 1];
          if (isdigit(static_cast<unsigned char>(c1)) &&
              isdigit(static_cast<unsigned char>(c0))) {
            // Trim leading '0': "...e+012" -> "...e+12\0"
            buf[len - 3] = c1;
            buf[len - 2] = c0;
            buf[--len] = 0;
          }
        }
      }
      S << buf;
      return;
    }
#endif
  }

  if (Style == FloatStyle::Percent)
    N *= 100.0;

  char Buf[32];
  format(Spec.c_str(), N).snprint(Buf, sizeof(Buf));
  S << Buf;
  if (Style == FloatStyle::Percent)
    S << '%';
}